

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O1

bool QFile::moveToTrash(QString *fileName,QString *pathInTrash)

{
  QArrayData *data;
  char16_t *pcVar1;
  qsizetype qVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  QArrayData *local_48;
  char16_t *pcStack_40;
  qsizetype local_38;
  QFile local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.super_QFileDevice.super_QIODevice.super_QObject._vptr_QObject =
       (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  local_28.super_QFileDevice.super_QIODevice.super_QObject.d_ptr.d =
       (QObjectData *)&DAT_aaaaaaaaaaaaaaaa;
  QFile(&local_28,fileName);
  bVar3 = moveToTrash(&local_28);
  if (bVar3 && pathInTrash != (QString *)0x0) {
    iVar4 = (*(local_28.super_QFileDevice.super_QIODevice.super_QObject.d_ptr.d)->_vptr_QObjectData
              [7])();
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 200))
              (&local_48,(long *)CONCAT44(extraout_var,iVar4),0);
    data = &((pathInTrash->d).d)->super_QArrayData;
    pcVar1 = (pathInTrash->d).ptr;
    (pathInTrash->d).d = (Data *)local_48;
    (pathInTrash->d).ptr = pcStack_40;
    qVar2 = (pathInTrash->d).size;
    (pathInTrash->d).size = local_38;
    local_48 = data;
    pcStack_40 = pcVar1;
    local_38 = qVar2;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
    }
  }
  ~QFile(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool
QFile::moveToTrash(const QString &fileName, QString *pathInTrash)
{
    QFile file(fileName);
    if (file.moveToTrash()) {
        if (pathInTrash)
            *pathInTrash = file.fileName();
        return true;
    }
    return false;
}